

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void Js::DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext *scriptContext)

{
  SourceDynamicProfileManager *this;
  code *pcVar1;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  FunctionBody *this_00;
  SourceContextInfo *pSVar6;
  FunctionInfo *pFVar7;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar8;
  Iterator local_48;
  Type local_38;
  
  pSVar8 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr
  ;
  local_48.list = pSVar8;
  local_48.current = &pSVar8->super_SListNodeBase<Memory::Recycler>;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    if (pSVar8 == (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_0096377c;
      *puVar4 = 0;
      pSVar8 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)local_48.current;
    }
    pSVar2 = local_48.list;
    pSVar8 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
             (pSVar8->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    if ((SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)local_38.ptr == pSVar2)
    {
      return;
    }
    pSVar8 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
             (((SListNodeBase<Memory::Recycler> *)&(local_48.current)->next)->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    local_48.current = local_38.ptr;
    pTVar5 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                       (&local_48);
    this_00 = GetFunctionBody(pTVar5->ptr);
    pSVar6 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
    this = (pSVar6->sourceDynamicProfileManager).ptr;
    pFVar7 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_0096377c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pFVar7 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    SourceDynamicProfileManager::SaveDynamicProfileInfo(this,pFVar7->functionId,pTVar5->ptr);
    pSVar8 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)local_48.current;
  } while( true );
}

Assistant:

void DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext * scriptContext)
    {
        // We don't clear old dynamic data here, because if a function is inlined, it will never go through the
        // EnsureDynamicProfileThunk and thus not appear in the list. We would want to keep those data as well.
        // Just save/update the data from function that has execute.

        // That means that the data will never go away, probably not a good policy if this is cached for web page in WININET.

        DynamicProfileInfoList * profileInfoList = scriptContext->GetProfileInfoList();
        FOREACH_SLISTBASE_ENTRY(DynamicProfileInfo * const, info, profileInfoList)
        {
            FunctionBody * functionBody = info->GetFunctionBody();
            SourceDynamicProfileManager * sourceDynamicProfileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
            sourceDynamicProfileManager->SaveDynamicProfileInfo(functionBody->GetLocalFunctionId(), info);
        }
        NEXT_SLISTBASE_ENTRY
    }